

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O3

string * testing::internal::StreamableToString<long_long>
                   (string *__return_storage_ptr__,longlong *streamable)

{
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  Message::Message((Message *)&local_20);
  std::ostream::_M_insert<long_long>((longlong)(local_20.ptr_ + 0x10));
  StringStreamToString(__return_storage_ptr__,local_20.ptr_);
  if (local_20.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_20.ptr_ + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}